

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_from_hex_pl(ptrlen hex)

{
  mp_int *pmVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = hex.len;
  if (uVar4 >> 0x3e == 0) {
    uVar5 = uVar4 * 4 + 0x3f >> 6;
    pmVar1 = mp_make_sized(uVar5 + (uVar5 == 0));
    bVar3 = 0;
    uVar5 = 0;
    while (uVar4 != 0) {
      iVar2 = (int)*(char *)((long)hex.ptr + (uVar4 - 1));
      lVar6 = (long)iVar2;
      pmVar1->w[uVar5 >> 4] =
           pmVar1->w[uVar5 >> 4] |
           (ulong)(iVar2 + (uint)(-1 < (long)((0x46U - lVar6 | lVar6 - 0x41U) &
                                             (0x66U - lVar6 | lVar6 - 0x61U))) * 9 & 0xf) <<
           (bVar3 & 0x3c);
      uVar5 = uVar5 + 1;
      bVar3 = bVar3 + 4;
      uVar4 = uVar4 - 1;
    }
    return pmVar1;
  }
  __assert_fail("hex.len <= (~(size_t)0) / 4",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x106,"mp_int *mp_from_hex_pl(ptrlen)");
}

Assistant:

mp_int *mp_from_hex_pl(ptrlen hex)
{
    assert(hex.len <= (~(size_t)0) / 4);
    size_t bits = hex.len * 4;
    size_t words = (bits + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
    words = size_t_max(words, 1);
    mp_int *x = mp_make_sized(words);
    for (size_t nibble = 0; nibble < hex.len; nibble++) {
        BignumInt digit = ((const char *)hex.ptr)[hex.len-1 - nibble];

        BignumInt lmask = ~-((BignumInt)((digit-'a')|('f'-digit))
                             >> (BIGNUM_INT_BITS-1));
        BignumInt umask = ~-((BignumInt)((digit-'A')|('F'-digit))
                             >> (BIGNUM_INT_BITS-1));

        BignumInt digitval = digit - '0';
        digitval ^= (digitval ^ (digit - 'a' + 10)) & lmask;
        digitval ^= (digitval ^ (digit - 'A' + 10)) & umask;
        digitval &= 0xF; /* at least be _slightly_ nice about weird input */

        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        x->w[word_idx] |= digitval << (nibble_within_word * 4);
    }
    return x;
}